

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

bool __thiscall re2::Regexp::ParseState::PushLiteral(ParseState *this,Rune r)

{
  bool bVar1;
  ParseFlags PVar2;
  Rune RVar3;
  ParseFlags b;
  Regexp *pRVar4;
  CharClassBuilder *this_00;
  Regexp *re;
  Rune r1;
  Regexp *re_1;
  Rune r_local;
  ParseState *this_local;
  
  PVar2 = operator&(this->flags_,FoldCase);
  if ((PVar2 != NoParseFlags) && (RVar3 = CycleFoldRune(r), RVar3 != r)) {
    pRVar4 = (Regexp *)operator_new(0x28);
    PVar2 = this->flags_;
    b = operator~(FoldCase);
    PVar2 = operator&(PVar2,b);
    Regexp(pRVar4,kRegexpCharClass,PVar2);
    this_00 = (CharClassBuilder *)operator_new(0x40);
    CharClassBuilder::CharClassBuilder(this_00);
    (pRVar4->field_7).field_3.ccb_ = this_00;
    re_1._4_4_ = r;
    do {
      PVar2 = operator&(this->flags_,NeverNL);
      if ((PVar2 == NoParseFlags) || (re_1._4_4_ != 10)) {
        CharClassBuilder::AddRange((pRVar4->field_7).field_3.ccb_,re_1._4_4_,re_1._4_4_);
      }
      re_1._4_4_ = CycleFoldRune(re_1._4_4_);
    } while (re_1._4_4_ != r);
    bVar1 = PushRegexp(this,pRVar4);
    return bVar1;
  }
  PVar2 = operator&(this->flags_,NeverNL);
  if ((PVar2 == NoParseFlags) || (r != 10)) {
    bVar1 = MaybeConcatString(this,r,this->flags_);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      pRVar4 = (Regexp *)operator_new(0x28);
      Regexp(pRVar4,kRegexpLiteral,this->flags_);
      (pRVar4->field_7).rune_ = r;
      this_local._7_1_ = PushRegexp(this,pRVar4);
    }
  }
  else {
    pRVar4 = (Regexp *)operator_new(0x28);
    Regexp(pRVar4,kRegexpNoMatch,this->flags_);
    this_local._7_1_ = PushRegexp(this,pRVar4);
  }
  return this_local._7_1_;
}

Assistant:

bool Regexp::ParseState::PushLiteral(Rune r) {
  // Do case folding if needed.
  if ((flags_ & FoldCase) && CycleFoldRune(r) != r) {
    Regexp* re = new Regexp(kRegexpCharClass, flags_ & ~FoldCase);
    re->ccb_ = new CharClassBuilder;
    Rune r1 = r;
    do {
      if (!(flags_ & NeverNL) || r != '\n') {
        re->ccb_->AddRange(r, r);
      }
      r = CycleFoldRune(r);
    } while (r != r1);
    return PushRegexp(re);
  }

  // Exclude newline if applicable.
  if ((flags_ & NeverNL) && r == '\n')
    return PushRegexp(new Regexp(kRegexpNoMatch, flags_));

  // No fancy stuff worked.  Ordinary literal.
  if (MaybeConcatString(r, flags_))
    return true;

  Regexp* re = new Regexp(kRegexpLiteral, flags_);
  re->rune_ = r;
  return PushRegexp(re);
}